

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O2

Constraint * create_is_false_constraint(void)

{
  CgreenValue expected_value;
  Constraint *pCVar1;
  CgreenValue local_20;
  
  make_cgreen_integer_value(&local_20,0);
  expected_value.value.integer_value = local_20.value.integer_value;
  expected_value.type = local_20.type;
  expected_value._4_4_ = local_20._4_4_;
  expected_value.value_size = local_20.value_size;
  pCVar1 = create_constraint_expecting(expected_value,"false");
  pCVar1->type = CGREEN_VALUE_COMPARER_CONSTRAINT;
  pCVar1->name = "be false";
  pCVar1->compare = compare_want_value;
  pCVar1->execute = test_want;
  pCVar1->actual_value_message = "";
  pCVar1->expected_value_message = "";
  return pCVar1;
}

Assistant:

Constraint *create_is_false_constraint(void) {
    Constraint *constraint = create_constraint_expecting(make_cgreen_integer_value(false), "false");
    constraint->type = CGREEN_VALUE_COMPARER_CONSTRAINT;

    constraint->name = "be false";
    constraint->compare = &compare_want_value;
    constraint->execute = &test_want;
    constraint->actual_value_message = "";
    constraint->expected_value_message = "";

    return constraint;
}